

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_data_to_file.cpp
# Opt level: O0

void create_folder(char *folder_name)

{
  int iVar1;
  char *in_RDI;
  stat st;
  stat sStack_98;
  char *local_8;
  
  local_8 = in_RDI;
  memset(&sStack_98,0,0x90);
  iVar1 = stat(local_8,&sStack_98);
  if (iVar1 == -1) {
    mkdir(local_8,0x1c0);
  }
  return;
}

Assistant:

void create_folder(const char *folder_name) {
    // create the folder if it doesn't exist
    struct stat st = {0};
    if (stat(folder_name, &st) == -1) {
#ifndef _WIN32
        mkdir(folder_name, 0700);
#else
        _mkdir(folder_name);
#endif
    }
}